

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

long __thiscall
wasm::Random::
pickGivenNum<long,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,short args,int args_1,int args_2,long args_3,
          long args_4,uchar args_5,unsigned_short args_6,uint args_7,unsigned_long args_8)

{
  long lVar1;
  
  if (num != 0) {
    lVar1 = pickGivenNum<long,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                      (this,num - 1,(long)args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,
                       args_8);
    return lVar1;
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }